

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

void Hop_ObjPrintVerilog(FILE *pFile,Hop_Obj_t *pObj,Vec_Vec_t *vLevels,int Level,int fOnlyAnds)

{
  undefined8 uVar1;
  int c;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  char *pcVar5;
  bool local_61;
  int local_58;
  int i;
  int fCompl;
  Hop_Obj_t *pFaninC;
  Hop_Obj_t *pFanin1;
  Hop_Obj_t *pFanin0;
  Hop_Obj_t *pFanin;
  Vec_Ptr_t *vSuper;
  int fOnlyAnds_local;
  int Level_local;
  Vec_Vec_t *vLevels_local;
  Hop_Obj_t *pObj_local;
  FILE *pFile_local;
  
  vSuper._0_4_ = fOnlyAnds;
  vSuper._4_4_ = Level;
  _fOnlyAnds_local = vLevels;
  vLevels_local = (Vec_Vec_t *)pObj;
  pObj_local = (Hop_Obj_t *)pFile;
  c = Hop_IsComplement(pObj);
  vLevels_local = (Vec_Vec_t *)Hop_Regular((Hop_Obj_t *)vLevels_local);
  iVar2 = Hop_ObjIsConst1((Hop_Obj_t *)vLevels_local);
  if (iVar2 == 0) {
    iVar2 = Hop_ObjIsPi((Hop_Obj_t *)vLevels_local);
    if (iVar2 == 0) {
      if (((int)vSuper == 0) && (iVar2 = Hop_ObjIsExor((Hop_Obj_t *)vLevels_local), iVar2 != 0)) {
        Vec_VecExpand(_fOnlyAnds_local,vSuper._4_4_);
        pFanin = (Hop_Obj_t *)Vec_VecEntry(_fOnlyAnds_local,vSuper._4_4_);
        Hop_ObjCollectMulti((Hop_Obj_t *)vLevels_local,(Vec_Ptr_t *)pFanin);
        pcVar5 = "(";
        if (vSuper._4_4_ == 0) {
          pcVar5 = "";
        }
        fprintf((FILE *)pObj_local,"%s",pcVar5);
        for (local_58 = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pFanin), local_58 < iVar2;
            local_58 = local_58 + 1) {
          pFanin0 = (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pFanin,local_58);
          pHVar4 = pObj_local;
          local_61 = c != 0 && local_58 == 0;
          pHVar3 = Hop_NotCond(pFanin0,(uint)local_61);
          Hop_ObjPrintVerilog((FILE *)pHVar4,pHVar3,_fOnlyAnds_local,vSuper._4_4_ + 1,(int)vSuper);
          iVar2 = Vec_PtrSize((Vec_Ptr_t *)pFanin);
          if (local_58 < iVar2 + -1) {
            fprintf((FILE *)pObj_local," ^ ");
          }
        }
        pcVar5 = ")";
        if (vSuper._4_4_ == 0) {
          pcVar5 = "";
        }
        fprintf((FILE *)pObj_local,"%s",pcVar5);
      }
      else if (((int)vSuper == 0) &&
              (iVar2 = Hop_ObjIsMuxType((Hop_Obj_t *)vLevels_local), iVar2 != 0)) {
        iVar2 = Hop_ObjRecognizeExor((Hop_Obj_t *)vLevels_local,&pFanin1,&pFaninC);
        if (iVar2 == 0) {
          pHVar4 = Hop_ObjRecognizeMux((Hop_Obj_t *)vLevels_local,&pFaninC,&pFanin1);
          pcVar5 = "(";
          if (vSuper._4_4_ == 0) {
            pcVar5 = "";
          }
          fprintf((FILE *)pObj_local,"%s",pcVar5);
          Hop_ObjPrintVerilog((FILE *)pObj_local,pHVar4,_fOnlyAnds_local,vSuper._4_4_ + 1,
                              (int)vSuper);
          fprintf((FILE *)pObj_local," ? ");
          pHVar4 = pObj_local;
          pHVar3 = Hop_NotCond(pFaninC,c);
          Hop_ObjPrintVerilog((FILE *)pHVar4,pHVar3,_fOnlyAnds_local,vSuper._4_4_ + 1,(int)vSuper);
          fprintf((FILE *)pObj_local," : ");
          pHVar4 = pObj_local;
          pHVar3 = Hop_NotCond(pFanin1,c);
          Hop_ObjPrintVerilog((FILE *)pHVar4,pHVar3,_fOnlyAnds_local,vSuper._4_4_ + 1,(int)vSuper);
          pcVar5 = ")";
          if (vSuper._4_4_ == 0) {
            pcVar5 = "";
          }
          fprintf((FILE *)pObj_local,"%s",pcVar5);
        }
        else {
          pcVar5 = "(";
          if (vSuper._4_4_ == 0) {
            pcVar5 = "";
          }
          fprintf((FILE *)pObj_local,"%s",pcVar5);
          pHVar4 = pObj_local;
          pHVar3 = Hop_NotCond(pFanin1,c);
          Hop_ObjPrintVerilog((FILE *)pHVar4,pHVar3,_fOnlyAnds_local,vSuper._4_4_ + 1,(int)vSuper);
          fprintf((FILE *)pObj_local," ^ ");
          Hop_ObjPrintVerilog((FILE *)pObj_local,pFaninC,_fOnlyAnds_local,vSuper._4_4_ + 1,
                              (int)vSuper);
          pcVar5 = ")";
          if (vSuper._4_4_ == 0) {
            pcVar5 = "";
          }
          fprintf((FILE *)pObj_local,"%s",pcVar5);
        }
      }
      else {
        Vec_VecExpand(_fOnlyAnds_local,vSuper._4_4_);
        pFanin = (Hop_Obj_t *)Vec_VecEntry(_fOnlyAnds_local,vSuper._4_4_);
        Hop_ObjCollectMulti((Hop_Obj_t *)vLevels_local,(Vec_Ptr_t *)pFanin);
        pcVar5 = "(";
        if (vSuper._4_4_ == 0) {
          pcVar5 = "";
        }
        fprintf((FILE *)pObj_local,"%s",pcVar5);
        for (local_58 = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pFanin), local_58 < iVar2;
            local_58 = local_58 + 1) {
          pFanin0 = (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pFanin,local_58);
          pHVar4 = pObj_local;
          pHVar3 = Hop_NotCond(pFanin0,c);
          Hop_ObjPrintVerilog((FILE *)pHVar4,pHVar3,_fOnlyAnds_local,vSuper._4_4_ + 1,(int)vSuper);
          iVar2 = Vec_PtrSize((Vec_Ptr_t *)pFanin);
          if (local_58 < iVar2 + -1) {
            pcVar5 = "&";
            if (c != 0) {
              pcVar5 = "|";
            }
            fprintf((FILE *)pObj_local," %s ",pcVar5);
          }
        }
        pcVar5 = ")";
        if (vSuper._4_4_ == 0) {
          pcVar5 = "";
        }
        fprintf((FILE *)pObj_local,"%s",pcVar5);
      }
    }
    else {
      pcVar5 = "";
      if (c != 0) {
        pcVar5 = "~";
      }
      uVar1._0_4_ = vLevels_local->nCap;
      uVar1._4_4_ = vLevels_local->nSize;
      fprintf((FILE *)pObj_local,"%s%s",pcVar5,uVar1);
    }
  }
  else {
    fprintf((FILE *)pObj_local,"1\'b%d",(ulong)((c != 0 ^ 0xffU) & 1));
  }
  return;
}

Assistant:

void Hop_ObjPrintVerilog( FILE * pFile, Hop_Obj_t * pObj, Vec_Vec_t * vLevels, int Level, int fOnlyAnds )
{
    Vec_Ptr_t * vSuper;
    Hop_Obj_t * pFanin, * pFanin0, * pFanin1, * pFaninC;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Hop_IsComplement(pObj);
    pObj = Hop_Regular(pObj);
    // constant case
    if ( Hop_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "1\'b%d", !fCompl );
        return;
    }
    // PI case
    if ( Hop_ObjIsPi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "~" : "", (char*)pObj->pData );
        return;
    }
    // EXOR case
    if ( !fOnlyAnds && Hop_ObjIsExor(pObj) )
    {
        Vec_VecExpand( vLevels, Level );
        vSuper = Vec_VecEntry( vLevels, Level );
        Hop_ObjCollectMulti( pObj, vSuper );
        fprintf( pFile, "%s", (Level==0? "" : "(") );
        Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
        {
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin, (fCompl && i==0)), vLevels, Level+1, fOnlyAnds );
            if ( i < Vec_PtrSize(vSuper) - 1 )
                fprintf( pFile, " ^ " );
        }
        fprintf( pFile, "%s", (Level==0? "" : ")") );
        return;
    }
    // MUX case
    if ( !fOnlyAnds && Hop_ObjIsMuxType(pObj) )
    {
        if ( Hop_ObjRecognizeExor( pObj, &pFanin0, &pFanin1 ) )
        {
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin0, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " ^ " );
            Hop_ObjPrintVerilog( pFile, pFanin1, vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        else 
        {
            pFaninC = Hop_ObjRecognizeMux( pObj, &pFanin1, &pFanin0 );
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Hop_ObjPrintVerilog( pFile, pFaninC, vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " ? " );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin1, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " : " );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin0, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Hop_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
    {
        Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin, fCompl), vLevels, Level+1, fOnlyAnds );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "|" : "&" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}